

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O0

SDKJsonResult * __thiscall
tonk::SDKSocket::Connect
          (SDKSocket *this,SDKConnection *sdkConnection,string *hostname,uint16_t port)

{
  SDKJsonResult *in_RDI;
  TonkResult result;
  TonkJson errorJson;
  TonkConnectionConfig config;
  SDKJsonResult *error;
  SDKConnection *in_stack_fffffffffffffb20;
  enable_shared_from_this<tonk::SDKConnection> *local_480;
  SDKJsonResult *pSStack_478;
  TonkResult local_454;
  char local_450 [952];
  TonkJson *in_stack_ffffffffffffff68;
  TonkConnection *in_stack_ffffffffffffff70;
  uint16_t in_stack_ffffffffffffff7e;
  char *in_stack_ffffffffffffff80;
  TonkSocket in_stack_ffffffffffffff88;
  TonkConnectionConfig in_stack_ffffffffffffffa0;
  
  MakeConnectionConfig(in_stack_fffffffffffffb20);
  memcpy(&local_480,&stack0xffffffffffffffb0,0x28);
  std::__cxx11::string::c_str();
  local_454 = tonk_connect(in_stack_ffffffffffffff88,in_stack_ffffffffffffffa0,
                           in_stack_ffffffffffffff80,in_stack_ffffffffffffff7e,
                           in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  SDKJsonResult::SDKJsonResult(pSStack_478);
  if (local_454 == Tonk_Success) {
    std::enable_shared_from_this<tonk::SDKConnection>::shared_from_this(local_480);
    std::shared_ptr<tonk::SDKConnection>::operator=
              ((shared_ptr<tonk::SDKConnection> *)pSStack_478,
               (shared_ptr<tonk::SDKConnection> *)local_480);
    std::shared_ptr<tonk::SDKConnection>::~shared_ptr((shared_ptr<tonk::SDKConnection> *)0x11f0f5);
  }
  else {
    (in_RDI->super_SDKResult).Result = local_454;
    std::__cxx11::string::operator=((string *)&in_RDI->ErrorJson,local_450);
  }
  return in_RDI;
}

Assistant:

SDKJsonResult SDKSocket::Connect(
    SDKConnection* sdkConnection,
    const std::string& hostname, ///< [in] Hostname of the remote host
    uint16_t port ///< [in] Port for the remote host
)
{
    TonkConnectionConfig config = MakeConnectionConfig(sdkConnection);

    TonkJson errorJson;
    TonkResult result = tonk_connect(
        MySocket,
        config,
        hostname.c_str(),
        port,
        &sdkConnection->MyConnection,
        &errorJson);

    SDKJsonResult error;
    if (TONK_FAILED(result))
    {
        error.Result = result;
        error.ErrorJson = errorJson.JsonString;
    }
    else
    {
        // Hold a self-reference if connection is started
        sdkConnection->SelfReference = sdkConnection->shared_from_this();
    }
    return error;
}